

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeechBubble.h
# Opt level: O2

SpeechBubble * __thiscall SpeechBubble::operator=(SpeechBubble *this,SpeechBubble *param_1)

{
  std::__cxx11::string::operator=((string *)this,(string *)param_1);
  std::__shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>,
             &(param_1->sprite).super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>);
  memcpy(&(this->soundSample).super_AudioSource.mFlags,
         &(param_1->soundSample).super_AudioSource.mFlags,0x90);
  (this->soundSample).mData = (param_1->soundSample).mData;
  (this->soundSample).mSampleCount = (param_1->soundSample).mSampleCount;
  this->timeElapsed = param_1->timeElapsed;
  this->position = param_1->position;
  this->scale = param_1->scale;
  return this;
}

Assistant:

SpeechBubble() = default;